

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O2

void protect_up(refs_table_t *tbl,uint64_t a)

{
  uint64_t uVar1;
  uint uVar2;
  uint64_t *puVar3;
  ulong uVar4;
  uint64_t *puVar5;
  int iVar6;
  bool bVar7;
  
  protect_enter(tbl);
  uVar4 = ((a >> 0x27 | a << 0x19) ^ (a ^ 0xcbf29ce484222325) * 0x100000001b3) * 0x100000001b3;
  do {
    while( true ) {
      iVar6 = 0x80;
      puVar5 = (uint64_t *)0x0;
      puVar3 = tbl->refs_table + (tbl->refs_size - 1 & (uVar4 >> 0x20 ^ uVar4));
      while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
        while (*puVar3 == 0) {
          if (puVar5 != (uint64_t *)0x0) goto LAB_0010f7bf;
          LOCK();
          uVar1 = *puVar3;
          if (uVar1 == 0) {
            *puVar3 = a;
          }
          UNLOCK();
          if (uVar1 == 0) goto LAB_0010f89a;
        }
        if ((*puVar3 == 0x7fffffffffffffff) && (puVar5 == (uint64_t *)0x0)) {
          puVar5 = puVar3;
        }
        puVar3 = puVar3 + 1;
        if (puVar3 == tbl->refs_table + tbl->refs_size) {
          puVar3 = tbl->refs_table;
        }
      }
      if (puVar5 != (uint64_t *)0x0) break;
      protect_leave(tbl);
      while (uVar2 = tbl->refs_control, uVar2 < 0x10000000) {
        LOCK();
        bVar7 = uVar2 == tbl->refs_control;
        if (bVar7) {
          tbl->refs_control = uVar2 | 0x80000000;
        }
        UNLOCK();
        if (bVar7) {
          do {
          } while( true );
        }
      }
      do {
        iVar6 = protect_resize_help(tbl);
      } while (iVar6 != 0);
      protect_enter(tbl);
    }
LAB_0010f7bf:
    LOCK();
    uVar1 = *puVar5;
    if (uVar1 == 0x7fffffffffffffff) {
      *puVar5 = a;
    }
    UNLOCK();
  } while (uVar1 != 0x7fffffffffffffff);
LAB_0010f89a:
  protect_leave(tbl);
  return;
}

Assistant:

void
protect_up(refs_table_t *tbl, uint64_t a)
{
    _Atomic(uint64_t)* bucket;
    _Atomic(uint64_t)* ts_bucket;
    uint64_t v;
    int i;

    protect_enter(tbl);

ref_retry:
    bucket = tbl->refs_table + (fnvhash8(a) & (tbl->refs_size - 1));
    ts_bucket = NULL; // tombstone
    i = 128; // try 128 times linear probing

    while (i--) {
ref_restart:
        v = *bucket;
        if (v == refs_ts) {
            if (ts_bucket == NULL) ts_bucket = bucket;
        } else if (v == 0) {
            // go go go
            if (ts_bucket != NULL) {
                v = refs_ts;
                if (atomic_compare_exchange_weak(ts_bucket, &v, a)) {
                    protect_leave(tbl);
                    return;
                } else {
                    goto ref_retry;
                }
            } else {
                if (atomic_compare_exchange_weak(bucket, &v, a)) {
                    protect_leave(tbl);
                    return;
                } else {
                    goto ref_restart;
                }
            }
        }

        if (++bucket == tbl->refs_table + tbl->refs_size) bucket = tbl->refs_table;
    }

    // not found after linear probing
    if (ts_bucket != NULL) {
        v = refs_ts;
        if (atomic_compare_exchange_weak(ts_bucket, &v, a)) {
            protect_leave(tbl);
            return;
        } else {
            goto ref_retry;
        }
    } else {
        // hash table full
        protect_leave(tbl);
        protect_resize(tbl);
        protect_enter(tbl);
        goto ref_retry;
    }
}